

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

int fsg_model_add_silence(fsg_model_t *fsg,char *silword,int state,float32 silprob)

{
  int wid;
  int iVar1;
  bitvec_t *pbVar2;
  int local_30;
  int src;
  int silwid;
  int n_trans;
  int32 logsilp;
  float32 silprob_local;
  int state_local;
  char *silword_local;
  fsg_model_t *fsg_local;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0x195,"Adding silence transitions for %s to FSG\n",silword);
  wid = fsg_model_word_add(fsg,silword);
  iVar1 = logmath_log(fsg->lmath,(float64)(double)(float)silprob);
  iVar1 = (int)((float)iVar1 * (float)fsg->lw);
  if (fsg->silwords == (bitvec_t *)0x0) {
    pbVar2 = (bitvec_t *)
             __ckd_calloc__((long)((fsg->n_word_alloc + 0x1f) / 0x20),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x19a);
    fsg->silwords = pbVar2;
  }
  fsg->silwords[wid / 0x20] = fsg->silwords[wid / 0x20] | (uint)(1L << ((byte)wid & 0x1f));
  src = 0;
  if (state == -1) {
    for (local_30 = 0; local_30 < fsg->n_state; local_30 = local_30 + 1) {
      fsg_model_trans_add(fsg,local_30,local_30,iVar1,wid);
      src = src + 1;
    }
  }
  else {
    fsg_model_trans_add(fsg,state,state,iVar1,wid);
    src = 1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0x1a9,"Added %d silence word transitions\n",(ulong)(uint)src);
  return src;
}

Assistant:

int
fsg_model_add_silence(fsg_model_t * fsg, char const *silword,
                      int state, float32 silprob)
{
    int32 logsilp;
    int n_trans, silwid, src;

    E_INFO("Adding silence transitions for %s to FSG\n", silword);

    silwid = fsg_model_word_add(fsg, silword);
    logsilp = (int32) (logmath_log(fsg->lmath, silprob) * fsg->lw);
    if (fsg->silwords == NULL)
        fsg->silwords = bitvec_alloc(fsg->n_word_alloc);
    bitvec_set(fsg->silwords, silwid);

    n_trans = 0;
    if (state == -1) {
        for (src = 0; src < fsg->n_state; src++) {
            fsg_model_trans_add(fsg, src, src, logsilp, silwid);
            ++n_trans;
        }
    }
    else {
        fsg_model_trans_add(fsg, state, state, logsilp, silwid);
        ++n_trans;
    }

    E_INFO("Added %d silence word transitions\n", n_trans);
    return n_trans;
}